

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat,int type)

{
  long lVar1;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  const_reference pvVar5;
  ulong uVar6;
  int in_ECX;
  reference in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  Mat feat_fp32_1;
  Mat feat_fp32;
  Mat bottom_blob_unpacked;
  int layer_index;
  int ret;
  int old_flush_denormals;
  int old_blocktime;
  Option *in_stack_fffffffffffffba8;
  Mat *pMVar7;
  Option *in_stack_fffffffffffffbb0;
  Mat *in_stack_fffffffffffffbb8;
  reference pvVar8;
  Mat *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  int iVar9;
  int local_3fc;
  Mat local_3a8;
  Mat local_360;
  value_type local_318;
  value_type local_2c0;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  reference local_260;
  int local_254;
  int local_244;
  reference local_240;
  reference local_238;
  value_type *local_230;
  value_type *local_228;
  Mat *local_220;
  int local_218;
  undefined4 local_214;
  reference local_210;
  reference local_208;
  int local_1f8;
  undefined4 local_1f4;
  reference local_1f0;
  reference local_1e8;
  int local_1d8;
  undefined4 local_1d4;
  reference local_1d0;
  reference local_1c8;
  int local_1b8;
  undefined4 local_1b4;
  reference local_1b0;
  reference local_1a8;
  int local_198;
  undefined4 local_194;
  reference local_190;
  reference local_188;
  value_type *local_178;
  value_type *local_168;
  Mat *local_158;
  Mat *local_148;
  int local_128;
  undefined4 local_124;
  Mat *local_120;
  int local_108;
  undefined4 local_104;
  Mat *local_100;
  int local_e8;
  undefined4 local_e4;
  value_type *local_e0;
  int local_c8;
  undefined4 local_c4;
  value_type *local_c0;
  int local_b8;
  undefined4 local_b4;
  reference local_b0;
  int local_a8;
  undefined4 local_a4;
  reference local_a0;
  int local_98;
  undefined4 local_94;
  reference local_90;
  int local_88;
  undefined4 local_84;
  reference local_80;
  int local_78;
  undefined4 local_74;
  reference local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_30;
  void *local_20;
  
  if ((in_ESI < 0) ||
     (local_264 = in_ECX, local_260 = in_RDX, local_254 = in_ESI,
     sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                       ), (int)sVar3 <= in_ESI)) {
    local_244 = -1;
  }
  else {
    local_268 = get_kmp_blocktime();
    set_kmp_blocktime(*(int *)(*(long *)(in_RDI + 8) + 0x38));
    local_26c = get_flush_denormals();
    set_flush_denormals(0x186594);
    local_270 = 0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                        ,(long)local_254);
    if (pvVar4->dims == 0) {
      this_00 = Net::blobs((Net *)**(undefined8 **)(in_RDI + 8));
      pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         (this_00,(long)local_254);
      local_274 = pvVar5->producer;
      if ((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) {
        if (*(long *)(*(long *)(in_RDI + 8) + 0x28) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x28) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 0xb0);
        }
        if (*(long *)(*(long *)(in_RDI + 8) + 0x30) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 0xb8);
        }
      }
      local_270 = NetPrivate::forward_layer
                            ((NetPrivate *)
                             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                             (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    }
    local_190 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           (*(long *)(in_RDI + 8) + 8),(long)local_254);
    pvVar4 = local_260;
    local_188 = local_260;
    if (local_260 != local_190) {
      if (local_190->refcount != (int *)0x0) {
        piVar2 = local_190->refcount;
        local_194 = 1;
        LOCK();
        local_198 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_b0 = local_260;
      if (local_260->refcount != (int *)0x0) {
        piVar2 = local_260->refcount;
        local_b4 = 0xffffffff;
        LOCK();
        local_b8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_b8 == 1) {
          if (local_260->allocator == (Allocator *)0x0) {
            local_48 = local_260->data;
            if (local_48 != (void *)0x0) {
              free(local_48);
            }
          }
          else {
            (*local_260->allocator->_vptr_Allocator[3])(local_260->allocator,local_260->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_190->data;
      pvVar4->refcount = local_190->refcount;
      pvVar4->elemsize = local_190->elemsize;
      pvVar4->elempack = local_190->elempack;
      pvVar4->allocator = local_190->allocator;
      pvVar4->dims = local_190->dims;
      pvVar4->w = local_190->w;
      pvVar4->h = local_190->h;
      pvVar4->d = local_190->d;
      pvVar4->c = local_190->c;
      pvVar4->cstep = local_190->cstep;
    }
    if ((((*(byte *)(*(long *)(in_RDI + 8) + 0x47) & 1) != 0) && (local_264 == 0)) &&
       (local_260->elempack != 1)) {
      local_230 = &local_2c0;
      local_2c0.data = (void *)0x0;
      local_2c0.refcount = (int *)0x0;
      local_2c0.elemsize = 0;
      local_2c0.elempack = 0;
      local_2c0.allocator = (Allocator *)0x0;
      local_2c0.dims = 0;
      local_2c0.w = 0;
      local_2c0.h = 0;
      local_2c0.d = 0;
      local_2c0.c = 0;
      local_2c0.cstep = 0;
      convert_packing(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                      (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),in_stack_fffffffffffffba8);
      pvVar4 = local_260;
      local_1a8 = local_260;
      local_1b0 = &local_2c0;
      if (local_260 != local_1b0) {
        if (local_2c0.refcount != (int *)0x0) {
          local_1b4 = 1;
          LOCK();
          local_1b8 = *local_2c0.refcount;
          *local_2c0.refcount = *local_2c0.refcount + 1;
          UNLOCK();
        }
        local_a0 = local_260;
        if (local_260->refcount != (int *)0x0) {
          piVar2 = local_260->refcount;
          local_a4 = 0xffffffff;
          LOCK();
          local_a8 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_a8 == 1) {
            if (local_260->allocator == (Allocator *)0x0) {
              local_50 = local_260->data;
              if (local_50 != (void *)0x0) {
                free(local_50);
              }
            }
            else {
              (*local_260->allocator->_vptr_Allocator[3])(local_260->allocator,local_260->data);
            }
          }
        }
        pvVar4->data = (void *)0x0;
        pvVar4->elemsize = 0;
        pvVar4->elempack = 0;
        pvVar4->dims = 0;
        pvVar4->w = 0;
        pvVar4->h = 0;
        pvVar4->d = 0;
        pvVar4->c = 0;
        pvVar4->cstep = 0;
        pvVar4->refcount = (int *)0x0;
        pvVar4->data = local_1b0->data;
        pvVar4->refcount = local_1b0->refcount;
        pvVar4->elemsize = local_1b0->elemsize;
        pvVar4->elempack = local_1b0->elempack;
        pvVar4->allocator = local_1b0->allocator;
        pvVar4->dims = local_1b0->dims;
        pvVar4->w = local_1b0->w;
        pvVar4->h = local_1b0->h;
        pvVar4->d = local_1b0->d;
        pvVar4->c = local_1b0->c;
        pvVar4->cstep = local_1b0->cstep;
      }
      local_178 = &local_2c0;
      local_c0 = local_178;
      if (local_2c0.refcount != (int *)0x0) {
        local_c4 = 0xffffffff;
        LOCK();
        local_c8 = *local_2c0.refcount;
        *local_2c0.refcount = *local_2c0.refcount + -1;
        UNLOCK();
        if (local_c8 == 1) {
          if (local_2c0.allocator == (Allocator *)0x0) {
            local_40 = local_2c0.data;
            if (local_2c0.data != (void *)0x0) {
              free(local_2c0.data);
            }
          }
          else {
            (*(local_2c0.allocator)->_vptr_Allocator[3])(local_2c0.allocator,local_2c0.data);
          }
        }
      }
      local_2c0.data = (void *)0x0;
      local_2c0.elemsize = 0;
      local_2c0.elempack = 0;
      local_2c0.dims = 0;
      local_2c0.w = 0;
      local_2c0.h = 0;
      local_2c0.d = 0;
      local_2c0.c = 0;
      local_2c0.cstep = 0;
      local_2c0.refcount = (int *)0x0;
    }
    if (((*(byte *)(*(long *)(in_RDI + 8) + 0x40) & 1) == 0) || (local_264 != 0)) {
      local_240 = local_260;
      if (local_260->elempack == 0) {
        iVar9 = 0;
      }
      else {
        uVar6 = local_260->elemsize << 3;
        iVar9 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                     (long)local_260->elempack);
      }
      if ((iVar9 == 8) && (local_264 == 0)) {
        local_220 = &local_360;
        local_360.data = (void *)0x0;
        local_360.refcount = (int *)0x0;
        local_360.elemsize = 0;
        local_360.elempack = 0;
        local_360.allocator = (Allocator *)0x0;
        local_360.dims = 0;
        local_360.w = 0;
        local_360.h = 0;
        local_360.d = 0;
        local_360.c = 0;
        local_360.cstep = 0;
        cast_int8_to_float32(local_220,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        local_1e8 = local_260;
        local_1f0 = &local_360;
        if (local_260 != local_1f0) {
          if (local_360.refcount != (int *)0x0) {
            local_1f4 = 1;
            LOCK();
            local_1f8 = *local_360.refcount;
            *local_360.refcount = *local_360.refcount + 1;
            UNLOCK();
          }
          local_80 = local_260;
          pvVar4 = local_260;
          pvVar8 = local_260;
          if (local_260->refcount != (int *)0x0) {
            piVar2 = local_260->refcount;
            local_84 = 0xffffffff;
            LOCK();
            local_88 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (local_88 == 1) {
              if (local_260->allocator == (Allocator *)0x0) {
                local_60 = local_260->data;
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
              }
              else {
                (*local_260->allocator->_vptr_Allocator[3])(local_260->allocator,local_260->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar8->data = local_1f0->data;
          pvVar8->refcount = local_1f0->refcount;
          pvVar8->elemsize = local_1f0->elemsize;
          pvVar8->elempack = local_1f0->elempack;
          pvVar8->allocator = local_1f0->allocator;
          pvVar8->dims = local_1f0->dims;
          pvVar8->w = local_1f0->w;
          pvVar8->h = local_1f0->h;
          pvVar8->d = local_1f0->d;
          pvVar8->c = local_1f0->c;
          pvVar8->cstep = local_1f0->cstep;
        }
        pMVar7 = &local_360;
        local_158 = pMVar7;
        local_100 = pMVar7;
        if (local_360.refcount != (int *)0x0) {
          local_104 = 0xffffffff;
          LOCK();
          local_108 = *local_360.refcount;
          *local_360.refcount = *local_360.refcount + -1;
          UNLOCK();
          if (local_108 == 1) {
            if (local_360.allocator == (Allocator *)0x0) {
              local_20 = local_360.data;
              if (local_360.data != (void *)0x0) {
                free(local_360.data);
              }
            }
            else {
              (*(local_360.allocator)->_vptr_Allocator[3])(local_360.allocator,local_360.data);
            }
          }
        }
        pMVar7->data = (void *)0x0;
        pMVar7->elemsize = 0;
        pMVar7->elempack = 0;
        pMVar7->dims = 0;
        pMVar7->w = 0;
        pMVar7->h = 0;
        pMVar7->d = 0;
        pMVar7->c = 0;
        pMVar7->cstep = 0;
        pMVar7->refcount = (int *)0x0;
      }
    }
    else {
      local_238 = local_260;
      if (local_260->elempack == 0) {
        local_3fc = 0;
      }
      else {
        uVar6 = local_260->elemsize << 3;
        local_3fc = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)local_260->elempack);
      }
      if (local_3fc == 0x10) {
        local_228 = &local_318;
        local_318.data = (void *)0x0;
        local_318.refcount = (int *)0x0;
        local_318.elemsize = 0;
        local_318.elempack = 0;
        local_318.allocator = (Allocator *)0x0;
        local_318.dims = 0;
        local_318.w = 0;
        local_318.h = 0;
        local_318.d = 0;
        local_318.c = 0;
        local_318.cstep = 0;
        cast_bfloat16_to_float32
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        pvVar4 = local_260;
        local_1c8 = local_260;
        local_1d0 = &local_318;
        if (local_260 != local_1d0) {
          if (local_318.refcount != (int *)0x0) {
            local_1d4 = 1;
            LOCK();
            local_1d8 = *local_318.refcount;
            *local_318.refcount = *local_318.refcount + 1;
            UNLOCK();
          }
          local_90 = local_260;
          if (local_260->refcount != (int *)0x0) {
            piVar2 = local_260->refcount;
            local_94 = 0xffffffff;
            LOCK();
            local_98 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (local_98 == 1) {
              if (local_260->allocator == (Allocator *)0x0) {
                local_58 = local_260->data;
                if (local_58 != (void *)0x0) {
                  free(local_58);
                }
              }
              else {
                (*local_260->allocator->_vptr_Allocator[3])(local_260->allocator,local_260->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar4->data = local_1d0->data;
          pvVar4->refcount = local_1d0->refcount;
          pvVar4->elemsize = local_1d0->elemsize;
          pvVar4->elempack = local_1d0->elempack;
          pvVar4->allocator = local_1d0->allocator;
          pvVar4->dims = local_1d0->dims;
          pvVar4->w = local_1d0->w;
          pvVar4->h = local_1d0->h;
          pvVar4->d = local_1d0->d;
          pvVar4->c = local_1d0->c;
          pvVar4->cstep = local_1d0->cstep;
        }
        local_168 = &local_318;
        local_e0 = local_168;
        if (local_318.refcount != (int *)0x0) {
          local_e4 = 0xffffffff;
          LOCK();
          local_e8 = *local_318.refcount;
          *local_318.refcount = *local_318.refcount + -1;
          UNLOCK();
          if (local_e8 == 1) {
            if (local_318.allocator == (Allocator *)0x0) {
              local_30 = local_318.data;
              if (local_318.data != (void *)0x0) {
                free(local_318.data);
              }
            }
            else {
              (*(local_318.allocator)->_vptr_Allocator[3])(local_318.allocator,local_318.data);
            }
          }
        }
        local_318.data = (void *)0x0;
        local_318.elemsize = 0;
        local_318.elempack = 0;
        local_318.dims = 0;
        local_318.w = 0;
        local_318.h = 0;
        local_318.d = 0;
        local_318.c = 0;
        local_318.cstep = 0;
        local_318.refcount = (int *)0x0;
      }
    }
    if (((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) &&
       (lVar1 = *(long *)(**(long **)(in_RDI + 8) + 0x48),
       local_260->allocator == *(Allocator **)(lVar1 + 0xb0))) {
      Mat::clone(&local_3a8,(__fn *)local_260,(void *)0x0,(int)lVar1,in_R8);
      local_208 = local_260;
      local_210 = &local_3a8;
      if (local_260 != local_210) {
        if (local_3a8.refcount != (int *)0x0) {
          local_214 = 1;
          LOCK();
          local_218 = *local_3a8.refcount;
          *local_3a8.refcount = *local_3a8.refcount + 1;
          UNLOCK();
        }
        local_70 = local_260;
        if (local_260->refcount != (int *)0x0) {
          piVar2 = local_260->refcount;
          local_74 = 0xffffffff;
          LOCK();
          local_78 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_78 == 1) {
            if (local_260->allocator == (Allocator *)0x0) {
              local_68 = local_260->data;
              if (local_68 != (void *)0x0) {
                free(local_68);
              }
            }
            else {
              (*local_260->allocator->_vptr_Allocator[3])(local_260->allocator,local_260->data);
            }
          }
        }
        local_260->data = (void *)0x0;
        local_260->elemsize = 0;
        local_260->elempack = 0;
        local_260->dims = 0;
        local_260->w = 0;
        local_260->h = 0;
        local_260->d = 0;
        local_260->c = 0;
        local_260->cstep = 0;
        local_260->refcount = (int *)0x0;
        local_260->data = local_210->data;
        local_260->refcount = local_210->refcount;
        local_260->elemsize = local_210->elemsize;
        local_260->elempack = local_210->elempack;
        local_260->allocator = local_210->allocator;
        local_260->dims = local_210->dims;
        local_260->w = local_210->w;
        local_260->h = local_210->h;
        local_260->d = local_210->d;
        local_260->c = local_210->c;
        local_260->cstep = local_210->cstep;
      }
      local_148 = &local_3a8;
      local_120 = local_148;
      if (local_3a8.refcount != (int *)0x0) {
        local_124 = 0xffffffff;
        LOCK();
        local_128 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_128 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
    }
    set_kmp_blocktime(local_268);
    set_flush_denormals(0x187e0d);
    local_244 = local_270;
  }
  return local_244;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat, int type)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    int old_blocktime = get_kmp_blocktime();
    set_kmp_blocktime(d->opt.openmp_blocktime);

    int old_flush_denormals = get_flush_denormals();
    set_flush_denormals(d->opt.flush_denormals);

    int ret = 0;

    if (d->blob_mats[blob_index].dims == 0)
    {
        int layer_index = d->net->blobs()[blob_index].producer;

        // use local allocator
        if (d->opt.use_local_pool_allocator)
        {
            if (!d->opt.blob_allocator)
            {
                d->opt.blob_allocator = d->net->d->local_blob_allocator;
            }
            if (!d->opt.workspace_allocator)
            {
                d->opt.workspace_allocator = d->net->d->local_workspace_allocator;
            }
        }

#if NCNN_VULKAN
        if (d->opt.use_vulkan_compute)
        {
            // use local allocator
            if (!d->opt.blob_vkallocator)
            {
                d->local_blob_vkallocator = d->net->vulkan_device()->acquire_blob_allocator();
                d->opt.blob_vkallocator = d->local_blob_vkallocator;
            }
            if (!d->opt.workspace_vkallocator)
            {
                d->opt.workspace_vkallocator = d->opt.blob_vkallocator;
            }
            if (!d->opt.staging_vkallocator)
            {
                d->local_staging_vkallocator = d->net->vulkan_device()->acquire_staging_allocator();
                d->opt.staging_vkallocator = d->local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(d->net->vulkan_device());
#if NCNN_BENCHMARK
            cmd.create_query_pool(d->net->layers().size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (d->opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
        }
#else
        ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
#endif // NCNN_VULKAN
    }

    feat = d->blob_mats[blob_index];

    if (d->opt.use_packing_layout && (type == 0) && feat.elempack != 1)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, d->opt);
        feat = bottom_blob_unpacked;
    }

    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (d->opt.use_fp16_storage && cpu_support_arm_asimdhp() && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_float16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_BF16
    if (d->opt.use_bf16_storage && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_bfloat16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_BF16
    if (feat.elembits() == 8 && (type == 0))
    {
        Mat feat_fp32;
        cast_int8_to_float32(feat, feat_fp32, d->opt);
        feat = feat_fp32;
    }
    // *INDENT-ON*
    // clang-format on

    if (d->opt.use_local_pool_allocator && feat.allocator == d->net->d->local_blob_allocator)
    {
        // detach the returned mat from local pool allocator
        // so we could destroy net instance much earlier
        feat = feat.clone();
    }

    set_kmp_blocktime(old_blocktime);
    set_flush_denormals(old_flush_denormals);

    return ret;
}